

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  undefined7 extraout_var;
  stbi_uc *psVar9;
  uchar *puVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint y;
  stbi_uc *psVar16;
  long lVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_b4 [4];
  stbi_uc *local_b0;
  ulong local_a8;
  ulong local_a0;
  uchar *local_98;
  ulong local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  iVar12 = 0x5c;
  local_7c = req_comp;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    stbi__get8(s);
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  bVar3 = stbi__get8(s);
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar12 = (*(s->io).eof)(s->io_user_data);
    if (iVar12 == 0) goto LAB_00162b65;
    if (s->read_from_callbacks == 0) goto LAB_00162fc8;
  }
  if (s->img_buffer_end <= s->img_buffer) {
LAB_00162fc8:
    stbi__g_failure_reason = "bad file";
    return (void *)0x0;
  }
LAB_00162b65:
  local_a0 = (ulong)bVar3 << 8;
  local_a8 = (ulong)bVar4;
  uVar13 = (int)local_a0 + (uint)bVar4;
  uVar11 = (ulong)uVar13;
  y = (uint)CONCAT11(sVar5,sVar6);
  if ((y != 0) && (((uint)(0x7fffffff / (ulong)y) < uVar13 || (0x1fffffff < y * uVar13)))) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  stbi__get32be(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  uVar20 = 0;
  local_98 = (uchar *)stbi__malloc_mad3(uVar13,y,4,0);
  local_80 = uVar13 * 4;
  local_90 = uVar11;
  memset(local_98,0xff,(ulong)(local_80 * y));
  pbVar19 = (byte *)(local_57 + 1);
  bVar3 = 0;
  do {
    iVar12 = (int)uVar11;
    if (uVar20 == 10) {
LAB_00162fd1:
      stbi__g_failure_reason = "bad format";
      goto LAB_00163009;
    }
    local_88 = uVar20;
    sVar5 = stbi__get8(s);
    uVar11 = CONCAT71(extraout_var,sVar5) & 0xffffffff;
    iVar12 = (int)CONCAT71(extraout_var,sVar5);
    bVar4 = stbi__get8(s);
    pbVar19[-2] = bVar4;
    bVar7 = stbi__get8(s);
    pbVar19[-1] = bVar7;
    bVar7 = stbi__get8(s);
    *pbVar19 = bVar7;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00162c84:
      if (s->img_buffer_end <= s->img_buffer) {
LAB_00162fec:
        stbi__g_failure_reason = "bad file";
        goto LAB_00163009;
      }
    }
    else {
      iVar8 = (*(s->io).eof)(s->io_user_data);
      if (iVar8 != 0) {
        if (s->read_from_callbacks != 0) goto LAB_00162c84;
        goto LAB_00162fec;
      }
    }
    if (bVar4 != 8) goto LAB_00162fd1;
    bVar3 = bVar3 | bVar7;
    pbVar19 = pbVar19 + 3;
    uVar20 = local_88 + 1;
  } while ((char)uVar11 != '\0');
  iVar12 = 4 - (uint)((bVar3 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = iVar12;
  }
  if (y != 0) {
    local_78 = (ulong)y;
    local_a0 = (ulong)(uint)((int)local_a0 + (int)local_a8);
    uVar11 = 0;
    local_88 = uVar20;
    do {
      local_b0 = local_98 + local_80 * (int)uVar11;
      uVar20 = 0;
      local_70 = uVar11;
      do {
        lVar2 = uVar20 * 3;
        cVar1 = local_57[lVar2];
        iVar8 = (int)local_90;
        local_a8 = uVar20;
        if (cVar1 == '\0') {
          if (iVar8 != 0) {
            bVar3 = local_57[lVar2 + 1];
            uVar11 = local_a0 & 0xffffffff;
            psVar16 = local_b0;
            do {
              psVar9 = stbi__readval(s,(uint)bVar3,psVar16);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_00163009;
              psVar16 = psVar16 + 4;
              uVar13 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar13;
            } while (uVar13 != 0);
          }
        }
        else if (cVar1 == '\x01') {
          uVar11 = local_90 & 0xffffffff;
          psVar16 = local_b0;
          if (iVar8 != 0) {
LAB_00162eb0:
            bVar3 = stbi__get8(s);
            if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00162ed8:
              if (s->img_buffer_end <= s->img_buffer) goto LAB_00163063;
            }
            else {
              iVar8 = (*(s->io).eof)(s->io_user_data);
              if (iVar8 != 0) {
                if (s->read_from_callbacks != 0) goto LAB_00162ed8;
LAB_00163063:
                stbi__g_failure_reason = "bad file";
                goto LAB_00163009;
              }
            }
            psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_b4);
            if (psVar9 == (stbi_uc *)0x0) goto LAB_00163009;
            uVar15 = (uint)uVar11;
            uVar13 = (uint)bVar3;
            if (uVar15 < bVar3) {
              uVar13 = uVar15;
            }
            uVar14 = uVar13 & 0xff;
            if ((char)uVar13 != '\0') {
              uVar13 = 0;
              do {
                bVar3 = local_57[lVar2 + 1];
                uVar18 = 0x80;
                lVar17 = 0;
                do {
                  if ((uVar18 & bVar3) != 0) {
                    psVar16[lVar17] = local_b4[lVar17];
                  }
                  lVar17 = lVar17 + 1;
                  uVar18 = uVar18 >> 1;
                } while (lVar17 != 4);
                uVar13 = uVar13 + 1;
                psVar16 = psVar16 + 4;
              } while (uVar13 != uVar14);
            }
            uVar11 = (ulong)(uVar15 - uVar14);
            if (uVar15 - uVar14 == 0 || (int)uVar15 < (int)uVar14) goto LAB_00162f85;
            goto LAB_00162eb0;
          }
        }
        else {
          if (cVar1 != '\x02') {
            stbi__g_failure_reason = "bad format";
            goto LAB_00163009;
          }
          uVar11 = local_90 & 0xffffffff;
          psVar16 = local_b0;
          if (iVar8 != 0) {
            do {
              bVar3 = stbi__get8(s);
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00162d97:
                if (s->img_buffer_end <= s->img_buffer) goto LAB_00163063;
              }
              else {
                iVar8 = (*(s->io).eof)(s->io_user_data);
                if (iVar8 != 0) {
                  if (s->read_from_callbacks != 0) goto LAB_00162d97;
                  goto LAB_00163063;
                }
              }
              uVar15 = (uint)uVar11;
              uVar13 = (uint)bVar3;
              if ((char)bVar3 < '\0') {
                if (uVar13 == 0x80) {
                  sVar5 = stbi__get8(s);
                  sVar6 = stbi__get8(s);
                  uVar14 = (uint)CONCAT11(sVar5,sVar6);
                }
                else {
                  uVar14 = uVar13 - 0x7f;
                }
                if ((int)uVar15 < (int)uVar14) {
                  stbi__g_failure_reason = "bad file";
                  goto LAB_00163009;
                }
                psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_b4);
                if (psVar9 == (stbi_uc *)0x0) goto LAB_00163009;
                if (0 < (int)uVar14) {
                  uVar13 = 0;
                  do {
                    bVar3 = local_57[lVar2 + 1];
                    uVar18 = 0x80;
                    lVar17 = 0;
                    do {
                      if ((uVar18 & bVar3) != 0) {
                        psVar16[lVar17] = local_b4[lVar17];
                      }
                      lVar17 = lVar17 + 1;
                      uVar18 = uVar18 >> 1;
                    } while (lVar17 != 4);
                    uVar13 = uVar13 + 1;
                    psVar16 = psVar16 + 4;
                  } while (uVar13 != uVar14);
                }
              }
              else {
                uVar14 = bVar3 + 1;
                uVar18 = uVar14;
                if (uVar15 <= uVar13) {
                  stbi__g_failure_reason = "bad file";
                  goto LAB_00163009;
                }
                do {
                  psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar16);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_00163009;
                  psVar16 = psVar16 + 4;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              uVar11 = (ulong)(uVar15 - uVar14);
            } while (uVar15 - uVar14 != 0 && (int)uVar14 <= (int)uVar15);
          }
        }
LAB_00162f85:
        uVar20 = local_a8 + 1;
      } while (local_88 != uVar20);
      uVar11 = local_70 + 1;
    } while (uVar11 != local_78);
  }
  puVar10 = local_98;
  if (local_98 == (uchar *)0x0) {
LAB_00163009:
    free(local_98);
    puVar10 = (uchar *)0x0;
  }
  *local_68 = (uint)local_90;
  *local_60 = y;
  if (local_7c != 0) {
    iVar12 = local_7c;
  }
  if (local_7c == 0 && comp != (int *)0x0) {
    iVar12 = *comp;
  }
  puVar10 = stbi__convert_format(puVar10,4,iVar12,(uint)local_90,y);
  return puVar10;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}